

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seriot_suite.cpp
# Opt level: O3

void n_structure_suite::n_structure_null_byte_outside_string(void)

{
  char input [4];
  string_view view;
  reader reader;
  undefined4 local_16c;
  value local_168;
  char local_164 [4];
  view_type local_160;
  basic_reader<char> local_150;
  
  local_160._M_str = local_164;
  local_164[0] = '[';
  local_164[1] = '\0';
  local_164[2] = ']';
  local_164[3] = '\0';
  local_160._M_len = 4;
  trial::protocol::json::basic_reader<char>::basic_reader(&local_150,&local_160);
  local_168 = local_150.decoder.current.code;
  local_16c = 0xc;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::begin_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0x91d,"void n_structure_suite::n_structure_null_byte_outside_string()",&local_168,
             &local_16c);
  trial::protocol::json::basic_reader<char>::next(&local_150);
  local_168 = local_150.decoder.current.code;
  local_16c = 0xffffffff;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::error_unexpected_token",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0x91f,"void n_structure_suite::n_structure_null_byte_outside_string()",&local_168,
             &local_16c);
  if (local_150.stack.c.
      super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_150.stack.c.
                    super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_150.stack.c.
                          super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_150.stack.c.
                          super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void n_structure_null_byte_outside_string()
{
    const char input[] = "[\x00]";
    core::detail::string_view view(input, sizeof(input)); // Capture nil character
    json::reader reader(view);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::begin_array);
    reader.next();
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::error_unexpected_token);
}